

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManDumpCnf(Gia_Man_t *p,char *pFileName,int fVerbose)

{
  Cnf_Dat_t *p_00;
  int iVar1;
  Gia_Man_t *p_01;
  long lVar2;
  int level;
  long lVar3;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p_01 = Jf_ManDeriveCnfMiter(p,fVerbose);
  p_00 = (Cnf_Dat_t *)p_01->pData;
  p_01->pData = (void *)0x0;
  Cnf_DataWriteIntoFile(p_00,pFileName,0,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  Gia_ManStop(p_01);
  printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)p_00->nVars,
         (ulong)(uint)p_00->nClauses,(ulong)(uint)p_00->nLiterals);
  level = 3;
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  Cnf_DataFree(p_00);
  return;
}

Assistant:

void Jf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Cnf_Dat_t * pCnf;
    pNew = Jf_ManDeriveCnfMiter( p, fVerbose );
    pCnf = (Cnf_Dat_t *)pNew->pData; pNew->pData = NULL;
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, NULL, NULL );
    Gia_ManStop( pNew );
//    if ( fVerbose )
    {
        printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Cnf_DataFree(pCnf);
}